

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattr_set.c
# Opt level: O0

int mpt_lattr_typeid(void)

{
  int local_c;
  int type;
  
  local_c = mpt_lattr_typeid::ptype;
  if ((mpt_lattr_typeid::ptype == 0) && (local_c = mpt_type_basic_add(4), 0 < local_c)) {
    mpt_lattr_typeid::ptype = local_c;
  }
  return local_c;
}

Assistant:

extern int mpt_lattr_typeid()
{
	static int ptype = 0;
	int type;
	if (!(type = ptype)) {
		if ((type = mpt_type_basic_add(sizeof(MPT_STRUCT(lineattr)))) > 0) {
			ptype = type;
		}
	}
	return type;
}